

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::
argument_loader<WorkSpace*,std::__cxx11::string_const&,unsigned_char,KmerCountMode>::
load_impl_sequence<0ul,1ul,2ul,3ul>(void *param_1,long param_2)

{
  reference pvVar1;
  initializer_list<bool> *this;
  type_caster_generic *this_00;
  __tuple_element_t<3UL,_tuple<type_caster<WorkSpace,_void>,_type_caster<basic_string<char>,_void>,_type_caster<unsigned_char,_void>,_type_caster<KmerCountMode,_void>_>_>
  *__n;
  const_iterator pbVar2;
  reference rVar3;
  bool r;
  const_iterator __end0;
  const_iterator __begin0;
  initializer_list<bool> *__range3;
  undefined8 in_stack_ffffffffffffff30;
  undefined1 convert;
  type_caster_generic *in_stack_ffffffffffffff38;
  size_type in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  const_iterator local_a0;
  reference local_98;
  undefined8 in_stack_ffffffffffffff78;
  undefined1 convert_00;
  reference local_68;
  PyObject *local_58;
  reference local_50;
  PyObject *local_40;
  undefined1 local_34;
  undefined1 local_33;
  undefined1 local_32;
  undefined1 in_stack_ffffffffffffffcf;
  string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  *in_stack_ffffffffffffffd0;
  handle in_stack_ffffffffffffffd8;
  
  convert_00 = (undefined1)((ulong)in_stack_ffffffffffffff78 >> 0x38);
  convert = (undefined1)((ulong)in_stack_ffffffffffffff30 >> 0x38);
  std::
  get<0ul,pybind11::detail::type_caster<WorkSpace,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<unsigned_char,void>,pybind11::detail::type_caster<KmerCountMode,void>>
            ((tuple<pybind11::detail::type_caster<WorkSpace,_void>,_pybind11::detail::type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_pybind11::detail::type_caster<unsigned_char,_void>,_pybind11::detail::type_caster<KmerCountMode,_void>_>
              *)0x4297a9);
  pvVar1 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(param_2 + 8),0
                     );
  local_40 = pvVar1->m_ptr;
  local_50 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)
                        CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                        in_stack_ffffffffffffff48);
  std::_Bit_reference::operator_cast_to_bool(&local_50);
  local_34 = type_caster_generic::load(in_stack_ffffffffffffff38,(handle)param_1,(bool)convert);
  this = (initializer_list<bool> *)
         std::
         get<1ul,pybind11::detail::type_caster<WorkSpace,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<unsigned_char,void>,pybind11::detail::type_caster<KmerCountMode,void>>
                   ((tuple<pybind11::detail::type_caster<WorkSpace,_void>,_pybind11::detail::type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_pybind11::detail::type_caster<unsigned_char,_void>,_pybind11::detail::type_caster<KmerCountMode,_void>_>
                     *)0x429829);
  pvVar1 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(param_2 + 8),1
                     );
  local_58 = pvVar1->m_ptr;
  local_68 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)
                        CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                        in_stack_ffffffffffffff48);
  std::_Bit_reference::operator_cast_to_bool(&local_68);
  local_33 = string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
             ::load(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffd8,
                    (bool)in_stack_ffffffffffffffcf);
  this_00 = (type_caster_generic *)
            std::
            get<2ul,pybind11::detail::type_caster<WorkSpace,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<unsigned_char,void>,pybind11::detail::type_caster<KmerCountMode,void>>
                      ((tuple<pybind11::detail::type_caster<WorkSpace,_void>,_pybind11::detail::type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_pybind11::detail::type_caster<unsigned_char,_void>,_pybind11::detail::type_caster<KmerCountMode,_void>_>
                        *)0x4298a4);
  std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
            ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(param_2 + 8),2);
  rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                    ((vector<bool,_std::allocator<bool>_> *)
                     CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                     in_stack_ffffffffffffff48);
  std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&stack0xffffffffffffff80);
  local_32 = type_caster<unsigned_char,_void>::load
                       ((type_caster<unsigned_char,_void> *)rVar3._M_p,(PyObject *)rVar3._M_mask,
                        (bool)convert_00);
  __n = std::
        get<3ul,pybind11::detail::type_caster<WorkSpace,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<unsigned_char,void>,pybind11::detail::type_caster<KmerCountMode,void>>
                  ((tuple<pybind11::detail::type_caster<WorkSpace,_void>,_pybind11::detail::type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_pybind11::detail::type_caster<unsigned_char,_void>,_pybind11::detail::type_caster<KmerCountMode,_void>_>
                    *)0x429919);
  std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
            ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(param_2 + 8),3);
  local_98 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)
                        CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),(size_type)__n
                       );
  std::_Bit_reference::operator_cast_to_bool(&local_98);
  type_caster_generic::load(this_00,(handle)param_1,SUB81((ulong)this >> 0x38,0));
  local_a0 = std::initializer_list<bool>::begin((initializer_list<bool> *)&stack0xffffffffffffffd0);
  pbVar2 = std::initializer_list<bool>::end(this);
  while( true ) {
    if (local_a0 == pbVar2) {
      return true;
    }
    if ((*local_a0 & 1U) == 0) break;
    local_a0 = local_a0 + 1;
  }
  return false;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }